

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cxx
# Opt level: O2

int main(int argc,char **argv)

{
  string *titleIn;
  allocator local_89;
  string local_88;
  App a;
  
  std::__cxx11::string::string((string *)&local_88,"SDL-App",&local_89);
  titleIn = &local_88;
  app::App::App(&a,titleIn);
  std::__cxx11::string::~string((string *)&local_88);
  app::App::init(&a,(EVP_PKEY_CTX *)titleIn);
  app::App::mainLoop(&a);
  std::operator<<((ostream *)&std::cout,"Finished");
  app::App::~App(&a);
  return 0;
}

Assistant:

int main(int argc, char** argv)
{
     app::App a;

     try {
          a.init();
     }

     catch (const error::InitError& e) {
          std::cerr << "Error while initializing App: "
                    << e.what() << std::endl;
          return 1;
     }

     a.mainLoop();

     std::cout << "Finished";

     return 0;
}